

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O0

void __thiscall CompilationContext::suppressWaring(CompilationContext *this,char *text_id)

{
  int iVar1;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int in_stack_0000001c;
  CompilationContext *in_stack_00000020;
  int i;
  int in_stack_000001f8;
  int in_stack_000001fc;
  char *in_stack_00000200;
  int in_stack_0000020c;
  CompilationContext *in_stack_00000210;
  allocator *__rhs;
  allocator local_59;
  string local_58 [32];
  string local_38 [36];
  uint local_14;
  char *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  while( true ) {
    if (0x58 < local_14) {
      __rhs = &local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Cannot suppress warning, text id not found: ",__rhs);
      std::operator+(in_RDI,(char *)__rhs);
      std::__cxx11::string::c_str();
      error(in_stack_00000210,in_stack_0000020c,in_stack_00000200,in_stack_000001fc,
            in_stack_000001f8);
      std::__cxx11::string::~string(local_38);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      return;
    }
    iVar1 = strcmp(local_10,analyzer_messages[(int)local_14].textId);
    if (iVar1 == 0) break;
    local_14 = local_14 + 1;
  }
  suppressWaring(in_stack_00000020,in_stack_0000001c);
  return;
}

Assistant:

void CompilationContext::suppressWaring(const char * text_id)
{
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
    if (!strcmp(text_id, analyzer_messages[i].textId))
    {
      suppressWaring(analyzer_messages[i].intId);
      return;
    }

  error(30, (string("Cannot suppress warning, text id not found: ") + text_id).c_str(), 0, 0);
}